

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MooDb.hpp
# Opt level: O2

void __thiscall Table::Save(Table *this,string *fileName)

{
  pointer pbVar1;
  pointer pvVar2;
  long lVar3;
  int p;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  string rowData;
  string tableColumns;
  string local_560;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  CowConfig cfg;
  
  std::__cxx11::string::string((string *)&local_500,(string *)fileName);
  CowConfig::CowConfig(&cfg,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tableColumns,"",(allocator<char> *)&rowData);
  lVar5 = 0;
  for (uVar4 = 0;
      pbVar1 = (this->Columns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->Columns).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar4 = uVar4 + 1) {
    std::operator+(&rowData,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar1->_M_dataplus)._M_p + lVar5),",");
    std::__cxx11::string::append((string *)&tableColumns);
    std::__cxx11::string::~string((string *)&rowData);
    lVar5 = lVar5 + 0x20;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"",(allocator<char> *)&rowData);
  std::__cxx11::string::string((string *)&local_560,(string *)&tableColumns);
  CowConfig::WriteLine(&cfg,&local_540,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_540);
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->Data).
                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->Data).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rowData,"",(allocator<char> *)&local_520);
    lVar5 = 0;
    for (uVar6 = 0;
        pvVar2 = (this->Data).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar3 = *(long *)&pvVar2[uVar4].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data,
        uVar6 < (ulong)((long)*(pointer *)
                               ((long)&pvVar2[uVar4].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) - lVar3 >> 5);
        uVar6 = uVar6 + 1) {
      lVar3 = std::__cxx11::string::find((char *)(lVar3 + lVar5),0x10617a);
      if (lVar3 == -1) {
        std::operator+(&local_520,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(this->Data).
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data + lVar5),",");
        std::__cxx11::string::append((string *)&rowData);
        std::__cxx11::string::~string((string *)&local_520);
      }
      else {
        std::operator+(&local_4a0,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(this->Data).
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data + lVar5));
        std::operator+(&local_520,&local_4a0,"\",");
        std::__cxx11::string::append((string *)&rowData);
        std::__cxx11::string::~string((string *)&local_520);
        std::__cxx11::string::~string((string *)&local_4a0);
      }
      lVar5 = lVar5 + 0x20;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"",(allocator<char> *)&local_520);
    std::__cxx11::string::string((string *)&local_4e0,(string *)&rowData);
    CowConfig::WriteLine(&cfg,&local_4c0,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&rowData);
  }
  std::__cxx11::string::~string((string *)&tableColumns);
  CowConfig::~CowConfig(&cfg);
  return;
}

Assistant:

void Save(std::string fileName){
		CowConfig cfg(fileName);
		std::string tableColumns = "";
		for (int p = 0; p < Columns.size(); p++)
			tableColumns += Columns[p] + ",";
		cfg.WriteLine("", tableColumns);

		for (int p = 0; p < Data.size(); p++){
			std::string rowData = "";
			for (int q = 0; q < Data[p].size(); q++){
				if (Data[p][q].find(",") != std::string::npos)
					rowData += "\"" + Data[p][q] + "\",";
				else
					rowData += Data[p][q] + ",";
			} // looping horizontally
			cfg.WriteLine("", rowData);
		} // looping vertically
	}